

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::MixMaterial::writeTo(MixMaterial *this,BinaryWriter *binary)

{
  BinaryWriter *in_RSI;
  SP *in_RDI;
  BinaryWriter *in_stack_ffffffffffffff48;
  BinaryWriter *in_stack_ffffffffffffff50;
  BinaryWriter *this_00;
  
  Material::writeTo((Material *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  this_00 = in_RSI;
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Material,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_ffffffffffffff50,
             (shared_ptr<pbrt::Material> *)in_stack_ffffffffffffff48);
  BinaryWriter::serialize(this_00,in_RDI);
  BinaryWriter::write<int>(in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x1242ba);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Material,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_ffffffffffffff50,
             (shared_ptr<pbrt::Material> *)in_stack_ffffffffffffff48);
  BinaryWriter::serialize(this_00,in_RDI);
  BinaryWriter::write<int>(in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x12431d);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_RSI,
             (shared_ptr<pbrt::Texture> *)in_stack_ffffffffffffff48);
  BinaryWriter::serialize(this_00,in_RDI);
  BinaryWriter::write<int>(in_RSI,(int *)in_stack_ffffffffffffff48);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x12437a);
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,(vec3f *)in_stack_ffffffffffffff48);
  return 0xd;
}

Assistant:

int MixMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(binary.serialize(material0));
    binary.write(binary.serialize(material1));
    binary.write(binary.serialize(map_amount));
    binary.write(amount);
    return TYPE_MIX_MATERIAL;
  }